

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::conversion::test_method(conversion *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  string_view str;
  const_string file_08;
  string_view str_00;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  arith_uint256 local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x10d;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_100 = "";
  UintToArith256((arith_uint256 *)&local_78,(uint256 *)ZeroL);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_108,0x10d,1,2,psVar2,"ArithToUint256(UintToArith256(ZeroL))",ZeroL,
             "ZeroL");
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x10e;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_130 = "";
  UintToArith256((arith_uint256 *)&local_78,(uint256 *)OneL);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_138,0x10e,1,2,psVar2,"ArithToUint256(UintToArith256(OneL))",OneL,
             "OneL");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x10f;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_160 = "";
  UintToArith256((arith_uint256 *)&local_78,(uint256 *)R1L);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_168,0x10f,1,2,psVar2,"ArithToUint256(UintToArith256(R1L))",R1L,"R1L");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x110;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_190 = "";
  UintToArith256((arith_uint256 *)&local_78,(uint256 *)R2L);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_198,0x110,1,2,psVar2,"ArithToUint256(UintToArith256(R2L))",R2L,"R2L");
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x111;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1c0 = "";
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)ZeroL);
  local_78._M_dataplus._M_p._0_4_ = 0;
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,arith_uint256,int>
            (&local_f8,&local_1c8,0x111,1,2,psVar2,"UintToArith256(ZeroL)",&local_78,"0");
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x112;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = (iterator)psVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e8,
             msg_04);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1f0 = "";
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)OneL);
  local_78._M_dataplus._M_p._0_4_ = 1;
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,arith_uint256,int>
            (&local_f8,&local_1f8,0x112,1,2,psVar2,"UintToArith256(OneL)",&local_78,"1");
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x113;
  file_05.m_begin = (iterator)&local_208;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_218,
             msg_05);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_220 = "";
  base_uint<256U>::base_uint((base_uint<256U> *)&local_78,0);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_228,0x113,1,2,psVar2,"ArithToUint256(0)",ZeroL,"ZeroL");
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x114;
  file_06.m_begin = (iterator)&local_238;
  msg_06.m_end = (iterator)psVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_248,
             msg_06);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_250 = "";
  base_uint<256U>::base_uint((base_uint<256U> *)&local_78,1);
  psVar2 = &local_58;
  ArithToUint256((uint256 *)psVar2,(arith_uint256 *)&local_78);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_258,0x114,1,2,psVar2,"ArithToUint256(1)",OneL,"OneL");
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x115;
  file_07.m_begin = (iterator)&local_268;
  msg_07.m_end = (iterator)psVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_278,
             msg_07);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_280 = "";
  base_blob<256u>::GetHex_abi_cxx11_(&local_98,(base_blob<256u> *)R1L);
  str._M_str = local_98._M_dataplus._M_p;
  str._M_len = local_98._M_string_length;
  uint256S((uint256 *)&local_78,str);
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)&local_78);
  UintToArith256(&local_b8,(uint256 *)R1L);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,arith_uint256,arith_uint256>
            (&local_f8,&local_288,0x115,1,2,psVar2,
             "arith_uint256(UintToArith256(uint256S(R1L.GetHex())))",&local_b8,"UintToArith256(R1L)"
            );
  std::__cxx11::string::~string((string *)&local_98);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x116;
  file_08.m_begin = (iterator)&local_298;
  msg_08.m_end = (iterator)psVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2a8,
             msg_08);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2b0 = "";
  base_blob<256u>::GetHex_abi_cxx11_(&local_98,(base_blob<256u> *)R2L);
  str_00._M_str = local_98._M_dataplus._M_p;
  str_00._M_len = local_98._M_string_length;
  uint256S((uint256 *)&local_78,str_00);
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)&local_78);
  UintToArith256(&local_b8,(uint256 *)R2L);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,arith_uint256,arith_uint256>
            (&local_f8,&local_2b8,0x116,1,2,psVar2,
             "arith_uint256(UintToArith256(uint256S(R2L.GetHex())))",&local_b8,"UintToArith256(R2L)"
            );
  std::__cxx11::string::~string((string *)&local_98);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x117;
  file_09.m_begin = (iterator)&local_2c8;
  msg_09.m_end = (iterator)psVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2d8,
             msg_09);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2e0 = "";
  base_blob<256u>::GetHex_abi_cxx11_(&local_58,(base_blob<256u> *)R1L);
  UintToArith256((arith_uint256 *)&local_98,(uint256 *)R1L);
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&local_98);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_2e8,0x117,1,2,psVar2,"R1L.GetHex()",&local_78,
             "UintToArith256(R1L).GetHex()");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x118;
  file_10.m_begin = (iterator)&local_2f8;
  msg_10.m_end = (iterator)psVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_308,
             msg_10);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_310 = "";
  base_blob<256u>::GetHex_abi_cxx11_(&local_58,(base_blob<256u> *)R2L);
  UintToArith256((arith_uint256 *)&local_98,(uint256 *)R2L);
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&local_98);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_318,0x118,1,2,&local_58,"R2L.GetHex()",&local_78,
             "UintToArith256(R2L).GetHex()");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( conversion )
{
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(ZeroL)), ZeroL);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(OneL)), OneL);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(R1L)), R1L);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(R2L)), R2L);
    BOOST_CHECK_EQUAL(UintToArith256(ZeroL), 0);
    BOOST_CHECK_EQUAL(UintToArith256(OneL), 1);
    BOOST_CHECK_EQUAL(ArithToUint256(0), ZeroL);
    BOOST_CHECK_EQUAL(ArithToUint256(1), OneL);
    BOOST_CHECK_EQUAL(arith_uint256(UintToArith256(uint256S(R1L.GetHex()))), UintToArith256(R1L));
    BOOST_CHECK_EQUAL(arith_uint256(UintToArith256(uint256S(R2L.GetHex()))), UintToArith256(R2L));
    BOOST_CHECK_EQUAL(R1L.GetHex(), UintToArith256(R1L).GetHex());
    BOOST_CHECK_EQUAL(R2L.GetHex(), UintToArith256(R2L).GetHex());
}